

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsplitter.cpp
# Opt level: O3

void __thiscall QSplitterHandle::moveSplitter(QSplitterHandle *this,int pos)

{
  long lVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  LayoutDirection LVar5;
  long lVar6;
  int index;
  QRect QVar7;
  
  lVar1 = *(long *)&(this->super_QWidget).field_0x8;
  LVar5 = QWidget::layoutDirection(*(QWidget **)(lVar1 + 600));
  if ((LVar5 == RightToLeft) && (*(int *)(lVar1 + 0x260) == 1)) {
    QVar7 = QWidget::contentsRect(*(QWidget **)(lVar1 + 600));
    pos = (QVar7.x2.m_i.m_i - (QVar7.x1.m_i.m_i + pos)) + 1;
  }
  lVar2 = *(long *)&((*(QSplitter **)(lVar1 + 600))->super_QFrame).super_QWidget.field_0x8;
  lVar3 = *(long *)(lVar2 + 0x298);
  index = -1;
  if (lVar3 != 0) {
    lVar6 = 0;
    do {
      lVar4 = *(long *)(*(long *)(lVar2 + 0x290) + lVar6 * 8);
      if ((*(QSplitterHandle **)(lVar4 + 0x18) == this) ||
         (*(QSplitterHandle **)(lVar4 + 0x20) == this)) {
        index = (int)lVar6;
        break;
      }
      lVar6 = lVar6 + 1;
    } while (lVar3 != lVar6);
  }
  QSplitter::moveSplitter(*(QSplitter **)(lVar1 + 600),pos,index);
  return;
}

Assistant:

void QSplitterHandle::moveSplitter(int pos)
{
    Q_D(QSplitterHandle);
    if (d->s->isRightToLeft() && d->orient == Qt::Horizontal)
        pos = d->s->contentsRect().width() - pos;
    d->s->moveSplitter(pos, d->s->indexOf(this));
}